

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<std::array<float,3ul>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,array<float,_3UL> *v)

{
  bool bVar1;
  value_type *pvVar2;
  optional<std::array<float,_3UL>_> local_7c;
  undefined1 local_6c [8];
  optional<std::array<float,_3UL>_> pv_1;
  undefined1 local_48 [8];
  optional<std::array<float,_3UL>_> pv;
  array<float,_3UL> *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (array<float,_3UL> *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_002d9667;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&pv.contained + 4),t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&pv.contained + 4));
  if (bVar1) {
    get_default_value<std::array<float,3ul>>
              ((optional<std::array<float,_3UL>_> *)((long)&pv_1.contained + 8),this);
    nonstd::optional_lite::optional<std::array<float,_3UL>_>::optional<std::array<float,_3UL>,_0>
              ((optional<std::array<float,_3UL>_> *)local_48,
               (optional<std::array<float,_3UL>_> *)((long)&pv_1.contained + 8));
    nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
              ((optional<std::array<float,_3UL>_> *)((long)&pv_1.contained + 8));
    pv_1.contained._4_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_48);
    if ((bool)pv_1.contained._4_1_) {
      pvVar2 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                         ((optional<std::array<float,_3UL>_> *)local_48);
      *(undefined8 *)v->_M_elems = *(undefined8 *)pvVar2->_M_elems;
      v->_M_elems[2] = pvVar2->_M_elems[2];
      this_local._7_1_ = 1;
    }
    pv_1.contained._5_3_ = 0;
    nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
              ((optional<std::array<float,_3UL>_> *)local_48);
    if (pv_1.contained._4_4_ != 0) goto LAB_002d9667;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_002d9667;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<std::array<float,_3UL>,_nullptr>(&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<std::array<float,3ul>>(&local_7c,this);
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::optional<std::array<float,_3UL>,_0>
                ((optional<std::array<float,_3UL>_> *)local_6c,&local_7c);
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional(&local_7c);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_6c);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                           ((optional<std::array<float,_3UL>_> *)local_6c);
        *(undefined8 *)v->_M_elems = *(undefined8 *)pvVar2->_M_elems;
        v->_M_elems[2] = pvVar2->_M_elems[2];
        this_local._7_1_ = 1;
      }
      pv_1.contained._5_3_ = 0;
      pv_1.contained._4_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                ((optional<std::array<float,_3UL>_> *)local_6c);
      if (pv_1.contained._4_4_ != 0) goto LAB_002d9667;
    }
    this_local._7_1_ = 0;
  }
LAB_002d9667:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }